

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_input_free(wally_tx_input *input,_Bool free_parent)

{
  _Bool free_parent_local;
  wally_tx_input *input_local;
  
  if (input != (wally_tx_input *)0x0) {
    clear_and_free(input->script,input->script_len);
    tx_witness_stack_free(input->witness,true);
    wally_tx_elements_input_issuance_free(input);
    wally_clear(input,0xd0);
    if (free_parent) {
      wally_free(input);
    }
  }
  return 0;
}

Assistant:

static int tx_input_free(struct wally_tx_input *input, bool free_parent)
{
    if (input) {
        clear_and_free(input->script, input->script_len);
        tx_witness_stack_free(input->witness, true);
        wally_tx_elements_input_issuance_free(input);
        wally_clear(input, sizeof(*input));
        if (free_parent)
            wally_free(input);
    }
    return WALLY_OK;
}